

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbgtool.c
# Opt level: O0

void bt1(FX *startFX)

{
  LispPTR LVar1;
  int iVar2;
  bool bVar3;
  int local_24;
  int c;
  int fnum;
  fnhead *fnobj;
  FX *fx;
  FX *startFX_local;
  
  BT_lines = 0;
  local_24 = 1;
  URaid_FXarray[0] = startFX;
  printf("%3d : ");
  _c = NativeAligned4FromLAddr(startFX->fnheader);
  LVar1 = LAddrFromNative(startFX);
  printf("   0x%x : ",(ulong)LVar1);
  print(_c[2] & 0xfffffff);
  putchar(10);
  BT_lines = BT_lines + 1;
  fnobj = (fnhead *)startFX;
  if (0x1e < BT_lines) {
    printf("Press Return(to quit Esc and Ret):");
    BT_temp = getchar();
    fflush(_stdin);
    BT_lines = 0;
    if (BT_temp == 0x1b) {
      longjmp((__jmp_buf_tag *)BT_jumpbuf,1);
    }
  }
  while( true ) {
    bVar3 = false;
    if ((_c[2] & 0xfffffff) != 0x4c) {
      bVar3 = fnobj->na != 0xb;
    }
    if (!bVar3) break;
    if (1999 < local_24) {
      printf("***There are more than %d stack frames.\n");
      printf(
            "If you want to continue, Uraid will smash its internal table for FX pointer. Do you accept?(Y or N)\n"
            );
      iVar2 = getchar();
      fflush(_stdin);
      if ((iVar2 != 0x59) && (iVar2 != 0x79)) goto LAB_00123187;
      local_24 = 0;
      memset(URaid_FXarray,0,8000);
    }
    fnobj = (fnhead *)get_nextFX((FX *)fnobj);
    _c = NativeAligned4FromLAddr(((FX *)fnobj)->fnheader);
    URaid_FXarray[local_24] = (FX *)fnobj;
    local_24 = local_24 + 1;
    printf("%3d : ");
    LVar1 = LAddrFromNative(fnobj);
    printf("   0x%x : ",(ulong)LVar1);
    print(_c[2] & 0xfffffff);
    putchar(10);
    BT_lines = BT_lines + 1;
    if (0x1e < BT_lines) {
      printf("Press Return(to quit Esc and Ret):");
      BT_temp = getchar();
      fflush(_stdin);
      BT_lines = 0;
      if (BT_temp == 0x1b) {
        longjmp((__jmp_buf_tag *)BT_jumpbuf,1);
      }
    }
  }
  if ((_c[2] & 0xfffffff) != 0x4c) {
    printf(">>root frame for contextsw<<\n");
    putchar(10);
    BT_lines = BT_lines + 1;
    if (0x1e < BT_lines) {
      printf("Press Return(to quit Esc and Ret):");
      BT_temp = getchar();
      fflush(_stdin);
      BT_lines = 0;
      if (BT_temp == 0x1b) {
        longjmp((__jmp_buf_tag *)BT_jumpbuf,1);
      }
    }
  }
LAB_00123187:
  URaid_ArrMAXIndex = local_24 + -1;
  URaid_currentFX = 0;
  return;
}

Assistant:

void bt1(FX *startFX) {
  FX *fx;
  struct fnhead *fnobj;
  FX *get_nextFX(FX * fx);
  int fnum = 0;
  BT_lines = 0;
  fx = startFX;
  URaid_FXarray[fnum] = fx;
  printf("%3d : ", fnum++);
#ifdef BIGVM
  fnobj = (struct fnhead *)NativeAligned4FromLAddr(fx->fnheader);
#else
  fnobj = (struct fnhead *)NativeAligned4FromLAddr(((int)fx->hi2fnheader << 16) | fx->lofnheader);
#endif /* BIGVM */
  printf("   0x%x : ", LAddrFromNative(fx));
  print(fnobj->framename);
  putchar('\n');
  BT_morep;
  while ((fnobj->framename != ATOM_T) && (fx->alink != 11)) {
    if (fnum > URMAXFXNUM - 1) {
      /* Internal buf overflow, too many stack frames */
      printf("***There are more than %d stack frames.\n", URMAXFXNUM);
      printf(
          "If you want to continue, Uraid will smash its internal table for FX pointer. Do you "
          "accept?(Y or N)\n");
      {
        int c;
        c = getchar();
        fflush(stdin);
        if ((c == 'Y') || (c == 'y')) {
          fnum = 0;
          memset(URaid_FXarray, 0, URMAXFXNUM * 4);
        } else
          goto bt1_exit;
      }
    }

    fx = get_nextFX(fx);
#ifdef BIGVM
    fnobj = (struct fnhead *)NativeAligned4FromLAddr(fx->fnheader);
#else
    fnobj = (struct fnhead *)NativeAligned4FromLAddr(((int)fx->hi2fnheader << 16) | fx->lofnheader);
#endif /* BIGVM */
    URaid_FXarray[fnum] = fx;
    printf("%3d : ", fnum++);
    printf("   0x%x : ", LAddrFromNative(fx));
    print(fnobj->framename);
    putchar('\n');
    BT_morep;
  }
  if (fnobj->framename != ATOM_T) {
    printf(">>root frame for contextsw<<\n");
    putchar('\n');
    BT_morep;
  }

bt1_exit:
  URaid_ArrMAXIndex = fnum - 1;
  URaid_currentFX = 0;
}